

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.cpp
# Opt level: O1

SpanContext *
jaegertracing::SpanContext::fromStream(SpanContext *__return_storage_ptr__,istream *in)

{
  TraceID TVar1;
  char ch;
  string buffer;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b0;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = 0;
  local_68[0] = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_78 = local_68;
  TVar1 = TraceID::fromStream(in);
  if (TVar1._high != 0 || TVar1._low != 0) {
    std::istream::get((char *)in);
  }
  (__return_storage_ptr__->super_SpanContext)._vptr_SpanContext =
       (_func_int **)&PTR__SpanContext_00266878;
  (__return_storage_ptr__->_traceID)._high = 0;
  (__return_storage_ptr__->_traceID)._low = 0;
  __return_storage_ptr__->_spanID = 0;
  __return_storage_ptr__->_parentID = 0;
  __return_storage_ptr__->_flags = '\0';
  (__return_storage_ptr__->_baggage)._M_h._M_buckets =
       &(__return_storage_ptr__->_baggage)._M_h._M_single_bucket;
  (__return_storage_ptr__->_baggage)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->_baggage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_baggage)._M_h._M_element_count = 0;
  (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_baggage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->_debugID)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_debugID).field_2;
  (__return_storage_ptr__->_debugID)._M_string_length = 0;
  (__return_storage_ptr__->_debugID).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

SpanContext SpanContext::fromStream(std::istream& in)
{
    SpanContext spanContext;
    spanContext._traceID = TraceID::fromStream(in);
    if (!spanContext._traceID.isValid()) {
        return SpanContext();
    }

    char ch = '\0';
    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    constexpr auto kMaxUInt64Chars = static_cast<size_t>(16);
    auto buffer = utils::HexParsing::readSegment(in, kMaxUInt64Chars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._spanID = utils::HexParsing::decodeHex<uint64_t>(buffer);

    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    buffer = utils::HexParsing::readSegment(in, kMaxUInt64Chars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._parentID = utils::HexParsing::decodeHex<uint64_t>(buffer);

    if (!in.get(ch) || ch != ':') {
        return SpanContext();
    }

    constexpr auto kMaxByteChars = static_cast<size_t>(2);
    buffer = utils::HexParsing::readSegment(in, kMaxByteChars, ':');
    if (buffer.empty()) {
        return SpanContext();
    }
    spanContext._flags = utils::HexParsing::decodeHex<unsigned char>(buffer);

    in.clear();
    return spanContext;
}